

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O1

void __thiscall
pbrt::SurfaceInteraction::ComputeDifferentials
          (SurfaceInteraction *this,RayDifferential *ray,CameraHandle *camera,int samplesPerPixel)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  float fVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Point3fi *pPVar17;
  Point3fi *pPVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  
  if (ray->hasDifferentials == true) {
    fVar1 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    fVar2 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    uVar14._0_4_ = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar14._4_4_ = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar14;
    auVar23 = vmovshdup_avx(auVar20);
    fVar34 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    fVar37 = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar23 = vfmadd213ss_fma(auVar23,ZEXT416((uint)fVar2),ZEXT416((uint)(fVar34 * fVar37)));
    auVar24 = ZEXT416((uint)fVar34);
    auVar22 = vfmsub231ss_fma(ZEXT416((uint)(fVar34 * fVar37)),auVar24,ZEXT416((uint)fVar37));
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ + auVar22._0_4_)),ZEXT416((uint)fVar1),
                              auVar20);
    fVar42 = auVar23._0_4_;
    if ((fVar42 != 0.0) || (NAN(fVar42))) {
      uVar19._0_4_ = (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar19._4_4_ = (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar19;
      auVar23 = vmovshdup_avx(auVar21);
      fVar3 = (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar23 = vfmadd213ss_fma(auVar23,ZEXT416((uint)fVar2),ZEXT416((uint)(fVar34 * fVar3)));
      auVar22 = vfmsub231ss_fma(ZEXT416((uint)(fVar34 * fVar3)),auVar24,ZEXT416((uint)fVar3));
      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ + auVar22._0_4_)),ZEXT416((uint)fVar1),
                                auVar21);
      fVar31 = auVar23._0_4_;
      if ((fVar31 != 0.0) || (NAN(fVar31))) {
        pPVar17 = &(this->super_Interaction).pi;
        pPVar18 = &(this->super_Interaction).pi;
        auVar23._0_4_ =
             (pPVar17->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             low;
        auVar23._4_4_ =
             (pPVar17->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
             high;
        auVar23._8_4_ =
             (pPVar18->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             low;
        auVar23._12_4_ =
             (pPVar18->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
             high;
        fVar13 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                 (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
        uVar5 = *(undefined8 *)
                 &(this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
        auVar23 = vinsertps_avx(auVar23,ZEXT416((uint)(this->super_Interaction).pi.
                                                      super_Point3<pbrt::Interval>.
                                                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                      high),0x10);
        auVar38._0_4_ = (float)uVar5 + auVar23._0_4_;
        auVar38._4_4_ = (float)((ulong)uVar5 >> 0x20) + auVar23._4_4_;
        auVar38._8_4_ = auVar23._8_4_ + 0.0;
        auVar38._12_4_ = auVar23._12_4_ + 0.0;
        auVar22._8_4_ = 0x3f000000;
        auVar22._0_8_ = 0x3f0000003f000000;
        auVar22._12_4_ = 0x3f000000;
        auVar20 = vmulps_avx512vl(auVar38,auVar22);
        uVar6._0_4_ = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
        uVar6._4_4_ = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar6;
        fVar4 = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
        auVar43._4_4_ = fVar34;
        auVar43._0_4_ = fVar34;
        auVar43._8_4_ = fVar34;
        auVar43._12_4_ = fVar34;
        auVar23 = vinsertps_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar4),0x10);
        auVar45._0_4_ = fVar34 * auVar23._0_4_;
        auVar45._4_4_ = fVar34 * auVar23._4_4_;
        auVar45._8_4_ = fVar34 * auVar23._8_4_;
        auVar45._12_4_ = fVar34 * auVar23._12_4_;
        auVar21 = vbroadcastss_avx512vl(ZEXT416((uint)fVar2));
        auVar22 = vinsertps_avx512f(auVar40,auVar20,0x4c);
        auVar22 = vfmadd213ps_avx512vl(auVar22,auVar21,auVar45);
        auVar23 = vfmsub213ps_fma(auVar23,auVar43,auVar45);
        auVar22 = vaddps_avx512vl(auVar22,auVar23);
        auVar44._4_4_ = fVar1;
        auVar44._0_4_ = fVar1;
        auVar44._8_4_ = fVar1;
        auVar44._12_4_ = fVar1;
        auVar23 = vinsertps_avx(auVar20,auVar40,0x1c);
        auVar22 = vfmadd213ps_fma(auVar23,auVar44,auVar22);
        auVar23 = vhsubps_avx(auVar22,auVar22);
        fVar42 = auVar23._0_4_ / fVar42;
        if (0x7f7fffff < (uint)ABS(fVar42)) {
          LogFatal<char_const(&)[25]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/interaction.cpp"
                     ,0x32,"Check failed: %s",(char (*) [25])"!IsInf(tx) && !IsNaN(tx)");
        }
        uVar7._0_4_ = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x;
        uVar7._4_4_ = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar7;
        auVar23 = vmovshdup_avx512vl(auVar41);
        fVar34 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z;
        auVar21 = vmulss_avx512f(auVar24,ZEXT416((uint)fVar34));
        auVar23 = vfmadd213ss_avx512f(auVar23,ZEXT416((uint)fVar2),auVar21);
        auVar24 = vfmsub213ss_avx512f(auVar24,ZEXT416((uint)fVar34),auVar21);
        auVar23 = vaddss_avx512f(auVar23,auVar24);
        auVar23 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar41,auVar23);
        fVar31 = (auVar22._0_4_ - auVar23._0_4_) / fVar31;
        if (0x7f7fffff < (uint)ABS(fVar31)) {
          LogFatal<char_const(&)[25]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/interaction.cpp"
                     ,0x35,"Check failed: %s",(char (*) [25])"!IsInf(ty) && !IsNaN(ty)");
        }
        auVar24._0_4_ = (float)(undefined4)uVar6 + (float)(undefined4)uVar14 * fVar42;
        auVar24._4_4_ = (float)uVar6._4_4_ + (float)uVar14._4_4_ * fVar42;
        auVar24._8_4_ = fVar42 * 0.0 + 0.0;
        auVar24._12_4_ = fVar42 * 0.0 + 0.0;
        auVar23 = vsubps_avx(auVar24,auVar20);
        uVar5 = vmovlps_avx(auVar23);
        (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar5;
        (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar5 >> 0x20);
        (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z = (fVar4 + fVar42 * fVar37) - fVar13;
        auVar25._0_4_ = (float)(undefined4)uVar7 + (float)(undefined4)uVar19 * fVar31;
        auVar25._4_4_ = (float)uVar7._4_4_ + (float)uVar19._4_4_ * fVar31;
        auVar25._8_4_ = fVar31 * 0.0 + 0.0;
        auVar25._12_4_ = fVar31 * 0.0 + 0.0;
        auVar23 = vsubps_avx(auVar25,auVar20);
        uVar5 = vmovlps_avx(auVar23);
        (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar5;
        (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar5 >> 0x20);
        (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z = (fVar34 + fVar3 * fVar31) - fVar13;
        goto LAB_002c9c3a;
      }
    }
  }
  CameraHandle::ApproximatedPdxy(camera,this,samplesPerPixel);
LAB_002c9c3a:
  fVar1 = (this->dpdu).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar2 = (this->dpdv).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar22 = ZEXT416((uint)(this->dpdu).super_Tuple3<pbrt::Vector3,_float>.x);
  auVar20 = ZEXT416((uint)(this->dpdv).super_Tuple3<pbrt::Vector3,_float>.x);
  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar2)),auVar22,auVar20);
  auVar24 = ZEXT416((uint)(this->dpdu).super_Tuple3<pbrt::Vector3,_float>.z);
  auVar21 = ZEXT416((uint)(this->dpdv).super_Tuple3<pbrt::Vector3,_float>.z);
  auVar23 = vfmadd231ss_fma(auVar23,auVar24,auVar21);
  fVar37 = auVar23._0_4_;
  auVar39._4_4_ = fVar37;
  auVar39._0_4_ = fVar37;
  auVar39._8_4_ = fVar37;
  auVar39._12_4_ = fVar37;
  auVar38 = vfnmadd213ss_fma(auVar23,auVar23,ZEXT416((uint)(fVar37 * fVar37)));
  auVar8._0_12_ = *(undefined1 (*) [12])&this->dpdx;
  auVar8._12_4_ = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar23 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),0x10);
  fVar1 = auVar23._0_4_;
  auVar35._0_4_ = fVar1 * fVar1;
  fVar2 = auVar23._4_4_;
  auVar35._4_4_ = fVar2 * fVar2;
  auVar35._8_4_ = auVar23._8_4_ * auVar23._8_4_;
  auVar35._12_4_ = auVar23._12_4_ * auVar23._12_4_;
  auVar23 = vinsertps_avx(auVar20,auVar22,0x10);
  auVar20 = vfmadd231ps_fma(auVar35,auVar23,auVar23);
  auVar22 = vinsertps_avx(auVar21,auVar24,0x10);
  auVar21 = vfmadd231ps_fma(auVar20,auVar22,auVar22);
  auVar24 = vshufps_avx(auVar21,auVar21,0x11);
  auVar20 = vmovshdup_avx(auVar21);
  auVar20 = vfmsub213ss_fma(auVar20,auVar21,ZEXT416((uint)(fVar37 * fVar37)));
  fVar34 = 1.0 / (auVar20._0_4_ + auVar38._0_4_);
  auVar20 = vshufps_avx(*(undefined1 (*) [16])&(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y,
                        ZEXT416((uint)(this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y),0);
  auVar29._0_4_ = fVar1 * auVar20._0_4_;
  auVar29._4_4_ = fVar2 * auVar20._4_4_;
  auVar29._8_4_ = fVar1 * auVar20._8_4_;
  auVar29._12_4_ = fVar2 * auVar20._12_4_;
  auVar26._0_8_ = auVar23._0_8_;
  auVar26._8_8_ = auVar26._0_8_;
  auVar23 = vshufps_avx(auVar8,ZEXT416((uint)(this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x),0);
  auVar20 = vfmadd213ps_fma(auVar23,auVar26,auVar29);
  auVar27._8_8_ = auVar22._0_8_;
  auVar27._0_8_ = auVar22._0_8_;
  auVar23 = vshufps_avx(*(undefined1 (*) [16])&(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z,
                        ZEXT416((uint)(this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z),0);
  auVar22 = vfmadd213ps_fma(auVar23,auVar27,auVar20);
  fVar34 = (float)((uint)((uint)ABS(fVar34) < 0x7f800000) * (int)fVar34);
  auVar23 = vshufps_avx(auVar22,auVar22,0xb1);
  auVar36._0_4_ = fVar37 * auVar23._0_4_;
  auVar36._4_4_ = fVar37 * auVar23._4_4_;
  auVar36._8_4_ = fVar37 * auVar23._8_4_;
  auVar36._12_4_ = fVar37 * auVar23._12_4_;
  auVar22 = vfmsub213ps_fma(auVar22,auVar24,auVar36);
  auVar23 = vfnmadd213ps_fma(auVar23,auVar39,auVar36);
  auVar30._0_4_ = auVar22._0_4_ + auVar23._0_4_;
  auVar30._4_4_ = auVar22._4_4_ + auVar23._4_4_;
  auVar30._8_4_ = auVar22._8_4_ + auVar23._8_4_;
  auVar30._12_4_ = auVar22._12_4_ + auVar23._12_4_;
  auVar23 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar28._0_4_ = auVar23._0_4_ * fVar34;
  auVar28._4_4_ = auVar23._4_4_ * fVar34;
  auVar28._8_4_ = auVar23._8_4_ * fVar34;
  auVar28._12_4_ = auVar23._12_4_ * fVar34;
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar23 = vandps_avx512vl(auVar28,auVar15);
  auVar32._8_4_ = 0xccbebc20;
  auVar32._0_8_ = 0xccbebc20ccbebc20;
  auVar32._12_4_ = 0xccbebc20;
  auVar33._8_4_ = 0x4cbebc20;
  auVar33._0_8_ = 0x4cbebc204cbebc20;
  auVar33._12_4_ = 0x4cbebc20;
  auVar16._8_4_ = 0x7f800000;
  auVar16._0_8_ = 0x7f8000007f800000;
  auVar16._12_4_ = 0x7f800000;
  uVar19 = vpcmpd_avx512vl(auVar23,auVar16,1);
  uVar19 = uVar19 & 0xf;
  uVar14 = vcmpps_avx512vl(auVar28,auVar32,1);
  auVar23 = vminps_avx(auVar33,auVar28);
  bVar9 = (bool)((byte)uVar14 & 1);
  bVar10 = (bool)((byte)(uVar14 >> 1) & 1);
  bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
  bVar12 = (bool)((byte)(uVar14 >> 3) & 1);
  this->dudx = (Float)((uint)((byte)uVar19 & 1) *
                      ((uint)bVar9 * -0x334143e0 | (uint)!bVar9 * auVar23._0_4_));
  this->dvdx = (Float)((uint)((byte)(uVar19 >> 1) & 1) *
                      ((uint)bVar10 * -0x334143e0 | (uint)!bVar10 * auVar23._4_4_));
  this->dudy = (Float)((uint)((byte)(uVar19 >> 2) & 1) *
                      ((uint)bVar11 * -0x334143e0 | (uint)!bVar11 * auVar23._8_4_));
  this->dvdy = (Float)((uint)(byte)(uVar19 >> 3) *
                      ((uint)bVar12 * -0x334143e0 | (uint)!bVar12 * auVar23._12_4_));
  return;
}

Assistant:

void SurfaceInteraction::ComputeDifferentials(const RayDifferential &ray,
                                              CameraHandle camera, int samplesPerPixel) {
    if (ray.hasDifferentials && Dot(n, ray.rxDirection) != 0 &&
        Dot(n, ray.ryDirection) != 0) {
        // Estimate screen-space change in $\pt{}$
        // Compute auxiliary intersection points with plane, _px_ and _py_
        Float d = -Dot(n, Vector3f(p()));
        Float tx = (-Dot(n, Vector3f(ray.rxOrigin)) - d) / Dot(n, ray.rxDirection);
        CHECK(!IsInf(tx) && !IsNaN(tx));
        Point3f px = ray.rxOrigin + tx * ray.rxDirection;
        Float ty = (-Dot(n, Vector3f(ray.ryOrigin)) - d) / Dot(n, ray.ryDirection);
        CHECK(!IsInf(ty) && !IsNaN(ty));
        Point3f py = ray.ryOrigin + ty * ray.ryDirection;

        dpdx = px - p();
        dpdy = py - p();

    } else
        camera.ApproximatedPdxy(*this, samplesPerPixel);
    // Estimate screen-space change in $(u,v)$
    Float a00 = Dot(dpdu, dpdu), a01 = Dot(dpdu, dpdv), a11 = Dot(dpdv, dpdv);
    Float invDet = 1 / (DifferenceOfProducts(a00, a11, a01, a01));

    Float b0x = Dot(dpdu, dpdx), b1x = Dot(dpdv, dpdx);
    Float b0y = Dot(dpdu, dpdy), b1y = Dot(dpdv, dpdy);

    /* Set the UV partials to zero if dpdu and/or dpdv == 0 */
    invDet = std::isfinite(invDet) ? invDet : 0.f;

    dudx = DifferenceOfProducts(a11, b0x, a01, b1x) * invDet;
    dvdx = DifferenceOfProducts(a00, b1x, a01, b0x) * invDet;

    dudy = DifferenceOfProducts(a11, b0y, a01, b1y) * invDet;
    dvdy = DifferenceOfProducts(a00, b1y, a01, b0y) * invDet;

    dudx = std::isfinite(dudx) ? Clamp(dudx, -1e8f, 1e8f) : 0.f;
    dvdx = std::isfinite(dvdx) ? Clamp(dvdx, -1e8f, 1e8f) : 0.f;
    dudy = std::isfinite(dudy) ? Clamp(dudy, -1e8f, 1e8f) : 0.f;
    dvdy = std::isfinite(dvdy) ? Clamp(dvdy, -1e8f, 1e8f) : 0.f;
}